

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::HlslParseContext::handleOutputGeometry
          (HlslParseContext *this,TSourceLoc *loc,TLayoutGeometry *geometry)

{
  TLayoutGeometry TVar1;
  TLayoutGeometry TVar2;
  TIntermediate *pTVar3;
  char *pcVar4;
  char *pcVar5;
  _func_int **pp_Var6;
  
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) {
    return true;
  }
  if (this->parsingEntrypointParameters != true) {
    return true;
  }
  TVar1 = *geometry;
  switch(TVar1) {
  case ElgPoints:
  case ElgLineStrip:
  case ElgTriangleStrip:
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar2 = pTVar3->outputPrimitive;
    if (TVar2 == ElgNone) {
      pTVar3->outputPrimitive = TVar1;
      return true;
    }
    if (TVar2 == TVar1) {
      return true;
    }
    if (*geometry - ElgPoints < 9) {
      pcVar4 = *(char **)(&DAT_00b09ee8 + (ulong)(*geometry - ElgPoints) * 8);
    }
    else {
      pcVar4 = "none";
    }
    pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = "output primitive geometry redefinition";
    goto LAB_00421226;
  case ElgLines:
    pcVar4 = "lines";
    break;
  case ElgLinesAdjacency:
    pcVar4 = "lines_adjacency";
    break;
  case ElgTriangles:
    pcVar4 = "triangles";
    break;
  case ElgTrianglesAdjacency:
    pcVar4 = "triangles_adjacency";
    break;
  case ElgQuads:
    pcVar4 = "quads";
    break;
  case ElgIsolines:
    pcVar4 = "isolines";
    break;
  default:
    pcVar4 = "none";
  }
  pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar5 = "cannot apply to \'out\'";
LAB_00421226:
  (*pp_Var6[0x2d])(this,loc,pcVar5,pcVar4,"");
  return false;
}

Assistant:

bool HlslParseContext::handleOutputGeometry(const TSourceLoc& loc, const TLayoutGeometry& geometry)
{
    // If this is not a geometry shader, ignore.  It might be a mixed shader including several stages.
    // Since that's an OK situation, return true for success.
    if (language != EShLangGeometry)
        return true;

    // these can be declared on non-entry-points, in which case they lose their meaning
    if (! parsingEntrypointParameters)
        return true;

    switch (geometry) {
    case ElgPoints:
    case ElgLineStrip:
    case ElgTriangleStrip:
        if (! intermediate.setOutputPrimitive(geometry)) {
            error(loc, "output primitive geometry redefinition", TQualifier::getGeometryString(geometry), "");
            return false;
        }
        break;
    default:
        error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(geometry), "");
        return false;
    }

    return true;
}